

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Complex> __thiscall Matrix<Complex>::fromRow(Matrix<Complex> *this,string *s)

{
  istream *piVar1;
  Complex *extraout_RDX;
  uint uVar2;
  ulong uVar3;
  Matrix<Complex> MVar4;
  vector<Complex,_std::allocator<Complex>_> v;
  Complex f;
  istringstream iss;
  string local_190 [368];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss);
  std::__cxx11::stringbuf::str(local_190);
  Complex::Complex(&f);
  v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  while( true ) {
    piVar1 = operator>>((istream *)&iss,&f);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<Complex,_std::allocator<Complex>_>::push_back(&v,&f);
  }
  if (v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    Matrix(this,1,1);
  }
  else {
    Matrix(this,1,(uint)((ulong)((long)v.super__Vector_base<Complex,_std::allocator<Complex>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)v.super__Vector_base<Complex,_std::allocator<Complex>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 7));
    uVar2 = 0;
    while( true ) {
      uVar3 = (ulong)uVar2;
      if ((ulong)((long)v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
                        super__Vector_impl_data._M_start >> 7) <= uVar3) break;
      Complex::operator=(this->arr + uVar3,
                         v.super__Vector_base<Complex,_std::allocator<Complex>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar3);
      uVar2 = uVar2 + 1;
    }
  }
  std::vector<Complex,_std::allocator<Complex>_>::~vector(&v);
  Complex::~Complex(&f);
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  MVar4.arr = extraout_RDX;
  MVar4._0_8_ = this;
  return MVar4;
}

Assistant:

const Matrix<Field> Matrix<Field>::fromRow(const std::string &s)
{
    std::istringstream iss;
    iss.str(s);
    Field f;
    std::vector<Field> v;
    while(iss >> f)
        v.push_back(f);
    if(v.empty())
        return Matrix(1, 1);
    Matrix m(1, v.size());
    for(unsigned i = 0; i < v.size(); ++i)
        m[0][i] = v[i];
    return m;
}